

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

const_iterator __thiscall
VulkanHppGenerator::findAlias
          (VulkanHppGenerator *this,string *name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
          *aliases)

{
  bool bVar1;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>
  __first;
  const_iterator __last;
  bool local_69;
  _Self local_48 [2];
  string *local_38;
  anon_class_8_1_898f2789_for__M_pred local_30;
  anon_class_8_1_898f2789_for__M_pred lambda;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  *aliases_local;
  string *name_local;
  VulkanHppGenerator *this_local;
  borrowed_iterator_t<const_std::map<std::__cxx11::basic_string<char>,_VulkanHppGenerator::NameLine>_&>
  it;
  
  local_38 = name;
  local_30.name = name;
  lambda.name = (string *)aliases;
  this_local = (VulkanHppGenerator *)
               std::ranges::__find_if_fn::
               operator()<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:2072:17)>
                         ((__find_if_fn *)&std::ranges::find_if,aliases,name);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
              *)lambda.name);
  bVar1 = std::operator==((_Self *)&this_local,local_48);
  local_69 = true;
  if (!bVar1) {
    __first = std::
              next<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                        ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>
                          )this_local,1);
    __last = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
                    *)lambda.name);
    local_69 = std::
               none_of<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,VulkanHppGenerator::findAlias(std::__cxx11::string_const&,std::map<std::__cxx11::string,VulkanHppGenerator::NameLine,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>const&)const::__0>
                         (__first,(_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>
                                   )__last._M_node,local_30);
  }
  if (local_69 == false) {
    __assert_fail("( it == aliases.end() ) || std::none_of( std::next( it ), aliases.end(), lambda )"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x81a,
                  "std::map<std::string, VulkanHppGenerator::NameLine>::const_iterator VulkanHppGenerator::findAlias(const std::string &, const std::map<std::string, NameLine> &) const"
                 );
  }
  return (const_iterator)(_Base_ptr)this_local;
}

Assistant:

std::map<std::string, VulkanHppGenerator::NameLine>::const_iterator VulkanHppGenerator::findAlias( std::string const &                     name,
                                                                                                   std::map<std::string, NameLine> const & aliases ) const
{
  auto lambda = [&name]( std::pair<std::string, NameLine> const & ad ) { return ad.second.name == name; };
  auto it     = std::ranges::find_if( aliases, lambda );
  assert( ( it == aliases.end() ) || std::none_of( std::next( it ), aliases.end(), lambda ) );
  return it;
}